

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Generators<arg_res_tuple<long_double,_1UL>_> * __thiscall
Catch::Generators::
makeGenerators<arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>>
          (Generators<arg_res_tuple<long_double,_1UL>_> *__return_storage_ptr__,Generators *this,
          arg_res_tuple<long_double,_1UL> *val,arg_res_tuple<long_double,_1UL> *moreGenerators,
          arg_res_tuple<long_double,_1UL> *moreGenerators_1,
          arg_res_tuple<long_double,_1UL> *moreGenerators_2)

{
  long *local_30;
  
  value<arg_res_tuple<long_double,1ul>>
            ((Generators *)&local_30,(arg_res_tuple<long_double,_1UL> *)this);
  Generators<arg_res_tuple<long_double,1ul>>::
  Generators<Catch::Generators::GeneratorWrapper<arg_res_tuple<long_double,1ul>>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>,arg_res_tuple<long_double,1ul>>
            ((Generators<arg_res_tuple<long_double,1ul>> *)__return_storage_ptr__,
             (GeneratorWrapper<arg_res_tuple<long_double,_1UL>_> *)&local_30,val,moreGenerators,
             moreGenerators_1);
  if (local_30 != (long *)0x0) {
    (**(code **)(*local_30 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }